

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::expectTimeScaleSpecifier
          (Preprocessor *this,Token *token,TimeScaleValue *value)

{
  BumpAllocator *alloc;
  double dVar1;
  bool bVar2;
  NumericTokenFlags NVar3;
  optional<slang::TimeUnit> timeUnit;
  optional<slang::TimeScaleValue> oVar4;
  SourceLocation location;
  DiagCode code;
  Token TVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  SourceRange range;
  Token suffix;
  size_t lengthConsumed;
  Token local_60;
  char *local_50;
  char *pcStack_48;
  Token local_40;
  
  TVar5 = peek(this);
  if (TVar5.kind == IntegerLiteral) {
    TVar5 = consume(this);
    *token = TVar5;
    suffix = peek(this);
    if ((suffix.kind == Identifier) && (bVar2 = Token::isOnSameLine(&suffix), bVar2)) {
      sVar6 = Token::rawText(&suffix);
      sVar7._M_str = (char *)&lengthConsumed;
      sVar7._M_len = (size_t)sVar6._M_str;
      timeUnit = suffixToTimeUnit((slang *)sVar6._M_len,sVar7,&lengthConsumed);
      if ((((ushort)timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) != 0) &&
         (sVar6 = Token::rawText(&suffix), lengthConsumed == sVar6._M_len)) {
        consume(this);
        sVar6 = Token::rawText(token);
        sVar7 = Token::rawText(&suffix);
        sVar8 = Token::rawText(&suffix);
        alloc = this->alloc;
        trivia = Token::trivia(token);
        local_50 = sVar7._M_str + (sVar8._M_len - (long)sVar6._M_str);
        pcStack_48 = sVar6._M_str;
        location = Token::location(token);
        Token::intValue(&local_60);
        dVar1 = SVInt::toDouble((SVInt *)&local_60);
        sVar6._M_str = pcStack_48;
        sVar6._M_len = (size_t)local_50;
        Token::Token(&local_40,alloc,TimeLiteral,trivia,sVar6,location,dVar1,false,timeUnit);
        token->kind = local_40.kind;
        token->field_0x2 = local_40._2_1_;
        token->numFlags = (NumericTokenFlags)local_40.numFlags.raw;
        token->rawLen = local_40.rawLen;
        token->info = local_40.info;
        SVInt::~SVInt((SVInt *)&local_60);
        goto LAB_00194125;
      }
    }
    range = Token::range(token);
    code.subsystem = Preprocessor;
    code.code = 10;
  }
  else {
    TVar5 = expect(this,TimeLiteral);
    *token = TVar5;
    if ((TVar5._0_4_ >> 0x10 & 1) != 0) {
      return false;
    }
LAB_00194125:
    dVar1 = Token::realValue(token);
    NVar3 = Token::numericFlags(token);
    oVar4 = TimeScaleValue::fromLiteral(dVar1,NVar3.raw >> 3 & (Picoseconds|Nanoseconds));
    if (((uint3)oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) {
      *value = (TimeScaleValue)
               oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
      return true;
    }
    range = Token::range(token);
    code.subsystem = Preprocessor;
    code.code = 0xf;
  }
  addDiag(this,code,range);
  return false;
}

Assistant:

bool Preprocessor::expectTimeScaleSpecifier(Token& token, TimeScaleValue& value) {
    if (peek(TokenKind::IntegerLiteral)) {
        // We wanted to see a time literal here, but for directives we will allow there
        // to be a space between the integer and suffix portions of the time.
        token = consume();

        auto suffix = peek();
        if (suffix.kind != TokenKind::Identifier || !suffix.isOnSameLine()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        size_t lengthConsumed;
        auto unit = suffixToTimeUnit(suffix.rawText(), lengthConsumed);
        if (!unit || lengthConsumed != suffix.rawText().length()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        // Glue the tokens together to form a "time literal"
        consume();
        auto start = token.rawText().data();
        auto end = suffix.rawText().data() + suffix.rawText().size();
        auto text = std::string_view(start, size_t(end - start));

        token = Token(alloc, TokenKind::TimeLiteral, token.trivia(), text, token.location(),
                      token.intValue().toDouble(), false, unit);
    }
    else {
        token = expect(TokenKind::TimeLiteral);
        if (token.isMissing())
            return false;
    }

    auto checked = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
    if (!checked) {
        addDiag(diag::InvalidTimeScaleSpecifier, token.range());
        return false;
    }

    value = *checked;
    return true;
}